

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O1

void __thiscall
tonk::gateway::StateMachine::BeginControlSOAPRequests(StateMachine *this,int controlIndex)

{
  ostringstream *this_00;
  undefined8 *puVar1;
  vector<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_> *this_01;
  int iVar2;
  pointer pCVar3;
  pointer pCVar4;
  HTTPRequester *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  SSDPRequester *pSVar5;
  bool bVar6;
  uint64_t nowUsec;
  ios_base *this_04;
  OutputWorker *pOVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  undefined1 local_1b8 [392];
  
  pCVar3 = (this->ControlEndpoints).
           super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  nowUsec = siamese::GetTimeUsec();
  this_01 = &pCVar3[controlIndex].Requests;
  uVar10 = (uint)((ulong)((long)(this->Requests).
                                super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->Requests).
                               super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (uVar10 != (int)((ulong)((long)(this_01->
                                    super__Vector_base<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_01->
                                   super__Vector_base<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>
                                   )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333)
  {
    std::vector<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>::
    resize(this_01,(long)(int)uVar10);
  }
  if (0 < (int)uVar10) {
    this_04 = (ios_base *)(local_1b8 + 0x80);
    lVar11 = 0x20;
    lVar9 = 4;
    uVar8 = 0;
    do {
      pCVar4 = (this_01->
               super__Vector_base<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar2 = *(int *)((long)&((this->Requests).
                               super__Vector_base<tonk::gateway::AppRequest,_std::allocator<tonk::gateway::AppRequest>_>
                               ._M_impl.super__Vector_impl_data._M_start)->LocalPort + lVar9);
      this_02 = *(HTTPRequester **)((long)pCVar4 + lVar11 + -0x18);
      if (this_02 == (HTTPRequester *)0x0) {
LAB_0013ca38:
        if (*(int *)((long)pCVar4 + lVar11 + -0x20) != iVar2) {
          *(int *)((long)pCVar4 + lVar11 + -0x20) = iVar2;
          if ((iVar2 == 1) && (*(short *)((long)pCVar4 + lVar11 + -6) != 0)) {
            *(undefined4 *)((long)pCVar4 + lVar11 + -0x1c) = 3;
            *(undefined1 *)((long)pCVar4 + lVar11 + -4) = 0;
            if (DAT_001bde60 < 2) {
              local_1b8._0_8_ = ModuleLogger;
              local_1b8._8_4_ = Debug;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),DAT_001bde90,DAT_001bde98);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10),
                         "Removing the gateway port mapping for local:",0x2c);
              std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_1b8 + 0x10)," <-> external:",0xe);
              std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
              pOVar7 = logger::OutputWorker::GetInstance();
              logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_1b8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
              std::ios_base::~ios_base(this_04);
            }
          }
          else if ((iVar2 == 0) &&
                  ((*(short *)((long)pCVar4 + lVar11 + -6) == 0 &&
                   (*(undefined4 *)((long)pCVar4 + lVar11 + -0x1c) = 3, DAT_001bde60 < 2)))) {
            local_1b8._0_8_ = ModuleLogger;
            local_1b8._8_4_ = Debug;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),DAT_001bde90,DAT_001bde98);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),"Adding the gateway port mapping for local:",
                       0x2a);
            std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
            pOVar7 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_1b8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
            std::ios_base::~ios_base(this_04);
          }
        }
        if ((((iVar2 == 0) && (*(char *)((long)pCVar4 + lVar11 + -4) == '\x01')) &&
            (*(short *)((long)pCVar4 + lVar11 + -6) != 0)) &&
           ((170000000 < nowUsec - *(long *)((long)&pCVar4->LastApp + lVar11) &&
            (*(undefined4 *)((long)pCVar4 + lVar11 + -0x1c) = 3, DAT_001bde60 < 2)))) {
          local_1b8._0_8_ = ModuleLogger;
          local_1b8._8_4_ = Debug;
          this_00 = (ostringstream *)(local_1b8 + 0x10);
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,DAT_001bde90,DAT_001bde98);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Time to renew the gateway port mapping for local:",0x31);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00," <-> external:",0xe);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          pOVar7 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base(this_04);
        }
        pSVar5 = this->SSDP;
        if (pSVar5->HaveSeenAGatewayAddress == true) {
          if ((pSVar5->LAN).Gateway.type_ == ipv4) {
            bVar6 = (pSVar5->LAN).Gateway.ipv4_address_.addr_.s_addr == 0;
LAB_0013cd40:
            if (bVar6) goto LAB_0013cd6c;
          }
          else if (((*(long *)&(pSVar5->LAN).Gateway.ipv6_address_.addr_.__in6_u == 0) &&
                   ((int)*(undefined8 *)
                          ((long)&(pSVar5->LAN).Gateway.ipv6_address_.addr_.__in6_u + 8) == 0)) &&
                  (((pSVar5->LAN).Gateway.ipv6_address_.addr_.__in6_u.__u6_addr8[0xd] == '\0' &&
                    (pSVar5->LAN).Gateway.ipv6_address_.addr_.__in6_u.__u6_addr8[0xc] == '\0' &&
                   ((pSVar5->LAN).Gateway.ipv6_address_.addr_.__in6_u.__u6_addr8[0xe] == '\0')))) {
            bVar6 = (pSVar5->LAN).Gateway.ipv6_address_.addr_.__in6_u.__u6_addr8[0xf] == '\0';
            goto LAB_0013cd40;
          }
          iVar2 = *(int *)((long)pCVar4 + lVar11 + -0x1c);
          if (0 < iVar2) {
            *(int *)((long)pCVar4 + lVar11 + -0x1c) = iVar2 + -1;
            RequestSOAP(this,controlIndex,(int)uVar8);
          }
        }
      }
      else {
        bVar6 = HTTPRequester::OnTick_IsDisposable(this_02,nowUsec);
        if (bVar6) {
          this_03 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)pCVar4 + lVar11 + -0x10);
          puVar1 = (undefined8 *)((long)pCVar4 + lVar11 + -0x18);
          *puVar1 = 0;
          puVar1[1] = 0;
          if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
          }
          goto LAB_0013ca38;
        }
      }
LAB_0013cd6c:
      uVar8 = uVar8 + 1;
      lVar11 = lVar11 + 0x28;
      lVar9 = lVar9 + 0x10;
    } while ((uVar10 & 0x7fffffff) != uVar8);
  }
  return;
}

Assistant:

void StateMachine::BeginControlSOAPRequests(int controlIndex)
{
    ControlEndpoint& control = ControlEndpoints[controlIndex];

    // Get current time
    const uint64_t nowUsec = siamese::GetTimeUsec();

    // Resize requests
    const int requestCount = (int)Requests.size();
    if (requestCount != (int)control.Requests.size()) {
        control.Requests.resize(requestCount);
    }

    // Check each request
    for (int requestIndex = 0; requestIndex < requestCount; ++requestIndex)
    {
        ControlRequest& controlRequest = control.Requests[requestIndex];
        const AppRequest app = Requests[requestIndex];

        // If HTTP request is already in progress:
        if (nullptr != controlRequest.Requester)
        {
            // If the requester is dead:
            if (controlRequest.Requester->OnTick_IsDisposable(nowUsec)) {
                // Free it so we can try again
                controlRequest.Requester = nullptr;
            }
            else {
                continue;
            }
        }

        // The application request type can fluctuate between Add/Remove at any time.

        // If the app request has changed:
        if (controlRequest.LastApp != app.Type)
        {
            controlRequest.LastApp = app.Type;

            if (app.Type == RequestType::Remove &&
                controlRequest.AddedExternalPort != 0)
            {
                // The app is requesting a remove and we had added a mapping
                controlRequest.RetriesRemaining = protocol::kPortMappingRetries;

                // Reset some state in case we want to add it again later
                controlRequest.AddAgainOnTimer = false;

                ModuleLogger.Debug("Removing the gateway port mapping for local:",
                    app.LocalPort, " <-> external:", controlRequest.AddedExternalPort);
            }
            else if (app.Type == RequestType::Add &&
                controlRequest.AddedExternalPort == 0)
            {
                // The app is requesting to add and we do not have a mapping
                controlRequest.RetriesRemaining = protocol::kPortMappingRetries;

                ModuleLogger.Debug("Adding the gateway port mapping for local:",
                    app.LocalPort);
            }
        }

        // If an external port was added successfully some time ago:
        if (app.Type == RequestType::Add &&
            controlRequest.AddAgainOnTimer &&
            controlRequest.AddedExternalPort != 0 &&
            nowUsec - controlRequest.LastSuccessUsec > protocol::kUPnPLeaseRenewSecs * 1000 * 1000)
        {
            /*
                Keep retrying forever after the lease renew interval elapses.

                This handles the case where the network goes down after a port
                is mapped, so the LAN info is still unchanged in Windows (same
                Local IP and same Gateway).  While the network is down, this
                causes continuous HTTP requests from the control endpoint about
                once per second until the uplink is restored or the LAN changes.

                LAN changes clear the AddAgainOnTimer flag to exit this loop.
            */
            controlRequest.RetriesRemaining = protocol::kPortMappingRetries;

            ModuleLogger.Debug("Time to renew the gateway port mapping for local:",
                app.LocalPort, " <-> external:", controlRequest.AddedExternalPort);
        }

        // If the network is definitely down avoid sending queries:
        if (SSDP->IsNetworkDefinitelyDown()) {
            continue;
        }

        // If there are no more retries:
        if (controlRequest.RetriesRemaining <= 0) {
            continue; // Do not retry
        }
        controlRequest.RetriesRemaining--;

        // If retries are remaining then we should perform a request
        RequestSOAP(controlIndex, requestIndex);
    }
}